

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O1

void NOPN2_GenerateResampled(ym3438_t *chip,Bit32s *buf)

{
  byte bVar1;
  Bit32u BVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  Bit32u *pBVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  Bit32s buffer [2];
  int local_60;
  int local_5c;
  Bit32u *local_58;
  int *local_50;
  Bit32u *local_48;
  Bit32u *local_40;
  Bit32u *local_38;
  
  iVar10 = chip->rateratio;
  iVar5 = chip->samplecnt;
  local_50 = buf;
  if (iVar10 <= iVar5) {
    local_38 = chip->mute + 2;
    local_40 = chip->mute + 4;
    local_58 = chip->mute;
    local_48 = chip->mute + 3;
    do {
      *(undefined8 *)chip->oldsamples = *(undefined8 *)chip->samples;
      chip->samples[0] = 0;
      chip->samples[1] = 0;
      iVar10 = 0;
      do {
        pBVar6 = chip->mute + 1;
        switch(chip->cycles >> 2) {
        case 0:
          break;
        case 1:
          pBVar6 = local_58 + (ulong)chip->dacen + 5;
          break;
        case 2:
          pBVar6 = local_48;
          break;
        case 3:
          pBVar6 = local_58;
          break;
        case 4:
          pBVar6 = local_40;
          break;
        case 5:
          pBVar6 = local_38;
          break;
        default:
          NOPN2_Clock(chip,&local_60);
          goto LAB_0013f0d2;
        }
        BVar2 = *pBVar6;
        NOPN2_Clock(chip,&local_60);
        if (BVar2 == 0) {
LAB_0013f0d2:
          chip->samples[0] = chip->samples[0] + local_60;
          chip->samples[1] = chip->samples[1] + local_5c;
        }
        uVar3 = chip->writebuf_samplecnt;
        uVar8 = (ulong)chip->writebuf_cur;
        uVar9 = uVar8 * 0x10;
        uVar4 = chip->writebuf[uVar8].time;
        while ((uVar4 <= uVar3 && (bVar1 = (&chip->writebuf[0].port)[uVar9], (bVar1 & 4) != 0))) {
          (&chip->writebuf[0].port)[uVar9] = bVar1 & 3;
          chip->write_data = (bVar1 & 2) << 7 | (ushort)(&chip->writebuf[0].data)[uVar9];
          if ((bVar1 & 1) == 0) {
            chip->write_a = chip->write_a | 1;
          }
          else {
            chip->write_d = chip->write_d | 1;
          }
          uVar7 = (int)uVar8 + 1U & 0x7ff;
          uVar8 = (ulong)uVar7;
          chip->writebuf_cur = uVar7;
          uVar9 = (ulong)(uVar7 << 4);
          uVar4 = *(ulong *)((long)&chip->writebuf[0].time + uVar9);
        }
        chip->writebuf_samplecnt = uVar3 + 1;
        iVar10 = iVar10 + 1;
      } while (iVar10 != 0x18);
      if (chip->use_filter == 0) {
        iVar10 = chip->samples[1];
        chip->samples[0] = chip->samples[0] * 0xb;
        iVar10 = iVar10 * 0xb;
      }
      else {
        iVar10 = chip->oldsamples[1];
        chip->samples[0] =
             (int)((double)(chip->samples[0] * 0xc - chip->oldsamples[0]) * 0.48766869871737195 +
                  (double)chip->oldsamples[0]);
        iVar10 = (int)((double)(chip->samples[1] * 0xc - iVar10) * 0.48766869871737195 +
                      (double)iVar10);
      }
      chip->samples[1] = iVar10;
      iVar10 = chip->rateratio;
      iVar5 = chip->samplecnt - iVar10;
      chip->samplecnt = iVar5;
    } while (iVar10 <= iVar5);
  }
  *local_50 = (iVar5 * chip->samples[0] + (iVar10 - iVar5) * chip->oldsamples[0]) / iVar10;
  local_50[1] = (chip->samplecnt * chip->samples[1] +
                (chip->rateratio - chip->samplecnt) * chip->oldsamples[1]) / chip->rateratio;
  chip->samplecnt = chip->samplecnt + 0x400;
  return;
}

Assistant:

void NOPN2_GenerateResampled(ym3438_t *chip, Bit32s *buf)
{
    Bit32u i;
    Bit32s buffer[2];
    Bit32u mute;
    
    while (chip->samplecnt >= chip->rateratio)
    {
        chip->oldsamples[0] = chip->samples[0];
        chip->oldsamples[1] = chip->samples[1];
        chip->samples[0] = chip->samples[1] = 0;
        for (i = 0; i < 24; i++)
        {
            switch (chip->cycles >> 2)
            {
            case 0: // Ch 2
                mute = chip->mute[1];
                break;
            case 1: // Ch 6, DAC
                mute = chip->mute[5 + chip->dacen];
                break;
            case 2: // Ch 4
                mute = chip->mute[3];
                break;
            case 3: // Ch 1
                mute = chip->mute[0];
                break;
            case 4: // Ch 5
                mute = chip->mute[4];
                break;
            case 5: // Ch 3
                mute = chip->mute[2];
                break;
            default:
                mute = 0;
                break;
            }
            NOPN2_Clock(chip, buffer);
            if (!mute)
            {
                chip->samples[0] += buffer[0];
                chip->samples[1] += buffer[1];
            }

            while (chip->writebuf[chip->writebuf_cur].time <= chip->writebuf_samplecnt)
            {
                if (!(chip->writebuf[chip->writebuf_cur].port & 0x04))
                {
                    break;
                }
                chip->writebuf[chip->writebuf_cur].port &= 0x03;
                NOPN2_Write(chip, chip->writebuf[chip->writebuf_cur].port,
                              chip->writebuf[chip->writebuf_cur].data);
                chip->writebuf_cur = (chip->writebuf_cur + 1) % NOPN_WRITEBUF_SIZE;
            }
            chip->writebuf_samplecnt++;
        }
        if(!chip->use_filter)
        {
            chip->samples[0] *= 11;
            chip->samples[1] *= 11;
        }
        else
        {
            chip->samples[0] = chip->oldsamples[0] + FILTER_CUTOFF_I * (chip->samples[0]*(11+1) - chip->oldsamples[0]);
            chip->samples[1] = chip->oldsamples[1] + FILTER_CUTOFF_I * (chip->samples[1]*(11+1) - chip->oldsamples[1]);
        }
        chip->samplecnt -= chip->rateratio;
    }
    buf[0] = (Bit32s)((chip->oldsamples[0] * (chip->rateratio - chip->samplecnt)
                     + chip->samples[0] * chip->samplecnt) / chip->rateratio);
    buf[1] = (Bit32s)((chip->oldsamples[1] * (chip->rateratio - chip->samplecnt)
                     + chip->samples[1] * chip->samplecnt) / chip->rateratio);
    chip->samplecnt += 1 << RSM_FRAC;
}